

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::ZipWriter::Write(ZipWriter *this,string *filename,string *contents)

{
  string_view sVar1;
  bool bVar2;
  undefined1 local_b0 [8];
  CodedOutputStream output;
  uint16_t filename_size;
  undefined1 local_50 [8];
  FileInfo info;
  string *contents_local;
  string *filename_local;
  ZipWriter *this_local;
  
  info._40_8_ = contents;
  FileInfo::FileInfo((FileInfo *)local_50);
  std::__cxx11::string::operator=((string *)local_50,(string *)filename);
  output.start_count_._2_2_ = std::__cxx11::string::size();
  info.name.field_2._8_4_ = (*this->raw_output_->_vptr_ZeroCopyOutputStream[4])();
  info.name.field_2._12_4_ = std::__cxx11::string::size();
  info.offset = ComputeCRC32((string *)info._40_8_);
  std::
  vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
  ::push_back(&this->files_,(value_type *)local_50);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ZeroCopyOutputStream,void>
            ((CodedOutputStream *)local_b0,this->raw_output_);
  io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_b0,0x4034b50);
  WriteShort((CodedOutputStream *)local_b0,10);
  WriteShort((CodedOutputStream *)local_b0,0);
  WriteShort((CodedOutputStream *)local_b0,0);
  WriteShort((CodedOutputStream *)local_b0,0);
  WriteShort((CodedOutputStream *)local_b0,0x21);
  io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_b0,info.offset);
  io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_b0,info.name.field_2._12_4_)
  ;
  io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_b0,info.name.field_2._12_4_)
  ;
  WriteShort((CodedOutputStream *)local_b0,output.start_count_._2_2_);
  WriteShort((CodedOutputStream *)local_b0,0);
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)filename);
  io::CodedOutputStream::WriteString((CodedOutputStream *)local_b0,sVar1);
  sVar1 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)info._40_8_);
  io::CodedOutputStream::WriteString((CodedOutputStream *)local_b0,sVar1);
  bVar2 = io::CodedOutputStream::HadError((CodedOutputStream *)local_b0);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_b0);
  FileInfo::~FileInfo((FileInfo *)local_50);
  return (bool)((bVar2 ^ 0xffU) & 1);
}

Assistant:

bool ZipWriter::Write(const std::string& filename,
                      const std::string& contents) {
  FileInfo info;

  info.name = filename;
  uint16_t filename_size = filename.size();
  info.offset = raw_output_->ByteCount();
  info.size = contents.size();
  info.crc32 = ComputeCRC32(contents);

  files_.push_back(info);

  // write file header
  io::CodedOutputStream output(raw_output_);
  output.WriteLittleEndian32(0x04034b50);  // magic
  WriteShort(&output, 10);                 // version needed to extract
  WriteShort(&output, 0);                  // flags
  WriteShort(&output, 0);                  // compression method: stored
  WriteShort(&output, 0);                  // last modified time
  WriteShort(&output, kDosEpoch);          // last modified date
  output.WriteLittleEndian32(info.crc32);  // crc-32
  output.WriteLittleEndian32(info.size);   // compressed size
  output.WriteLittleEndian32(info.size);   // uncompressed size
  WriteShort(&output, filename_size);      // file name length
  WriteShort(&output, 0);                  // extra field length
  output.WriteString(filename);            // file name
  output.WriteString(contents);            // file data

  return !output.HadError();
}